

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t cfd::core::TxIn::EstimateTxInSize
                   (AddressType addr_type,Script *redeem_script,uint32_t *witness_area_size,
                   uint32_t *no_witness_area_size,Script *scriptsig_template)

{
  uint32_t uVar1;
  size_t sVar2;
  CfdException *this;
  uint uVar3;
  uint32_t uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  bool bVar9;
  uint32_t reqnum;
  undefined1 local_78 [32];
  uint32_t *local_58;
  uint32_t *local_50;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_48;
  
  uVar3 = addr_type - kP2shAddress;
  local_50 = witness_area_size;
  if (uVar3 < 7) {
    bVar6 = (byte)uVar3;
    bVar7 = 0x40 >> (bVar6 & 0x1f);
    bVar5 = 0x33 >> (bVar6 & 0x1f);
    bVar6 = 0x7c >> (bVar6 & 0x1f);
  }
  else {
    bVar9 = Script::IsEmpty(redeem_script);
    if (bVar9) {
      local_78._0_8_ = "cfdcore_transaction.cpp";
      local_78._8_4_ = 0x6f;
      local_78._16_8_ = "EstimateTxInSize";
      logger::log<>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                    "unknown address type, and empty redeem script.");
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._0_8_ = local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"unknown address type, and empty redeem script.","");
      CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_78);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar5 = 1;
    bVar7 = 0;
    bVar6 = 0;
    uVar3 = 0;
  }
  local_58 = no_witness_area_size;
  if ((uVar3 & 1) == 0) {
    if ((scriptsig_template == (Script *)0x0) ||
       (bVar9 = Script::IsEmpty(scriptsig_template), bVar9)) {
      uVar4 = 0x4c;
      iVar8 = 0x42;
      if ((bVar7 & 1) == 0) {
        bVar9 = Script::IsEmpty(redeem_script);
        iVar8 = 0x8c;
        if (!bVar9) {
          Script::GetData((ByteData *)local_78,redeem_script);
          sVar2 = ByteData::GetSerializeSize((ByteData *)local_78);
          if ((pointer)local_78._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_78._0_8_);
          }
          local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
          ScriptUtil::ExtractPubkeysFromMultisigScript(&local_48,redeem_script,(uint32_t *)local_78)
          ;
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_48);
          iVar8 = (int)sVar2 + 2 + local_78._0_4_ * 0x4a;
          if (local_78._0_4_ == 0) {
            iVar8 = (int)sVar2 + 0x8c;
          }
        }
      }
    }
    else {
      Script::GetData((ByteData *)local_78,scriptsig_template);
      sVar2 = ByteData::GetSerializeSize((ByteData *)local_78);
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_);
      }
      uVar4 = 0x4c;
      iVar8 = (int)sVar2;
    }
  }
  else {
    uVar4 = 0x40;
    iVar8 = 0x6c;
  }
  uVar1 = 0x29;
  if ((bVar5 & 1) != 0) {
    uVar1 = uVar4;
  }
  bVar9 = (bVar6 & 1) == 0;
  if (bVar9) {
    uVar1 = iVar8 + 0x2a;
  }
  uVar4 = 0;
  if (!bVar9) {
    uVar4 = iVar8 + 1;
  }
  if (local_50 != (uint32_t *)0x0) {
    *local_50 = uVar4;
  }
  if (local_58 != (uint32_t *)0x0) {
    *local_58 = uVar1;
  }
  return uVar1 + uVar4;
}

Assistant:

uint32_t TxIn::EstimateTxInSize(
    AddressType addr_type, Script redeem_script, uint32_t *witness_area_size,
    uint32_t *no_witness_area_size, const Script *scriptsig_template) {
  bool is_pubkey = false;
  bool is_witness = true;
  bool is_taproot = false;
  bool use_unlocking_script = true;
  uint32_t size = kMinimumTxInSize;
  uint32_t witness_size = 0;
  uint32_t script_size = 0;

  switch (addr_type) {
    case AddressType::kP2shAddress:
      is_witness = false;
      break;
    case AddressType::kP2pkhAddress:
      is_pubkey = true;
      is_witness = false;
      break;
    case AddressType::kP2wshAddress:
      use_unlocking_script = false;
      break;
    case AddressType::kP2wpkhAddress:
      is_pubkey = true;
      use_unlocking_script = false;
      break;
    case AddressType::kP2shP2wshAddress:
      break;
    case AddressType::kP2shP2wpkhAddress:
      is_pubkey = true;
      break;
    case AddressType::kTaprootAddress:
      is_taproot = true;
      use_unlocking_script = false;
      break;
    default:
      if (redeem_script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "unknown address type, and empty redeem script.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unknown address type, and empty redeem script.");
      }
      is_witness = false;
      break;
  }

  if (is_pubkey) {
    script_size = Pubkey::kCompressedPubkeySize + EC_SIGNATURE_DER_MAX_LEN + 3;
  } else if (
      (scriptsig_template != nullptr) && (!scriptsig_template->IsEmpty())) {
    script_size = static_cast<uint32_t>(
        scriptsig_template->GetData().GetSerializeSize());
  } else if (is_taproot) {
    // signature(64byte) + sighash type(1byte) + serialized(1byte)
    script_size = SchnorrSignature::kSchnorrSignatureSize + 2;
  } else {
    // Forehead is a big size
    script_size = (EC_SIGNATURE_DER_MAX_LEN - 2) * 2;
    if (!redeem_script.IsEmpty()) {
      size_t redeem_script_size = redeem_script.GetData().GetSerializeSize();
      script_size += static_cast<uint32_t>(redeem_script_size);
      try {
        // OP_0 <sig1> <sig2> ... <unlocking script>
        uint32_t reqnum = 0;
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &reqnum);
        if (reqnum != 0) {
          // set multisig size
          script_size = static_cast<uint32_t>(redeem_script_size);
          script_size += (EC_SIGNATURE_DER_MAX_LEN + 2) * reqnum;
          script_size += 2;  // for top OP_0 size
        }
      } catch (const CfdException &except) {
        if (except.GetErrorCode() != CfdError::kCfdIllegalArgumentError) {
          // error occurs other than multisig confirmation
          throw except;
        }
      }
    }
  }

  if (is_witness) {
    witness_size = script_size + 1;  // witness stack count area(1byte)
    if (!use_unlocking_script) {
      // do nothing
    } else if (is_pubkey) {
      size += 23;  // wpkh locking script length + serialize size(1byte)
    } else {
      size += 35;  // wsh locking script length + serialize size(1byte)
    }
  } else {
    size += script_size + 1;  // serialize size(1byte)
  }
  if (witness_area_size != nullptr) {
    *witness_area_size = static_cast<uint32_t>(witness_size);
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = static_cast<uint32_t>(size);
  }
  size += witness_size;
  return static_cast<uint32_t>(size);
}